

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O1

Equality __thiscall capnp::AnyStruct::Reader::equals(Reader *this,Reader right)

{
  ushort uVar1;
  void *__s1;
  SegmentReader *pSVar2;
  Reader right_00;
  long lVar3;
  int iVar4;
  PointerType PVar5;
  Equality EVar6;
  size_t sVar7;
  size_t sVar8;
  size_t __n;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  Equality local_a8;
  PointerReader local_a0;
  WirePointer *local_80;
  CapTableReader *local_78;
  SegmentReader *local_70;
  WirePointer *local_68;
  CapTableReader *local_60;
  SegmentReader *local_58;
  SegmentReader *local_50;
  CapTableReader *pCStack_48;
  long local_40;
  int iStack_38;
  undefined4 uStack_34;
  
  __s1 = (this->_reader).data;
  __n = (ulong)((this->_reader).dataSize >> 3) + 1;
  do {
    sVar8 = __n;
    if (sVar8 == 1) {
      __n = 0;
      break;
    }
    __n = sVar8 - 1;
  } while (*(char *)((long)__s1 + (sVar8 - 2)) == '\0');
  sVar7 = (ulong)(right._reader.dataSize >> 3) + 1;
  do {
    if (sVar7 == 1) {
      sVar10 = 0;
      break;
    }
    sVar10 = sVar7 - 1;
    lVar3 = sVar7 - 2;
    sVar7 = sVar10;
  } while (*(char *)((long)right._reader.data + lVar3) == '\0');
  bVar13 = __n == sVar10;
  if ((sVar8 != 1) && (__n == sVar10)) {
    iVar4 = bcmp(__s1,right._reader.data,__n);
    bVar13 = iVar4 == 0;
  }
  local_a8 = NOT_EQUAL;
  if (bVar13) {
    pSVar2 = (this->_reader).segment;
    local_60 = (this->_reader).capTable;
    local_68 = (this->_reader).pointers;
    uVar1 = (this->_reader).pointerCount;
    uVar12 = (ulong)uVar1;
    iVar4 = (this->_reader).nestingLimit;
    local_58 = pSVar2;
    if (uVar12 != 0) {
      uVar11 = (ulong)uVar1 * 0x40 + 0x3fffffffc0;
      do {
        local_a0.pointer =
             (WirePointer *)((long)&(local_68->offsetAndKind).value + (uVar11 >> 3 & 0x7fffffff8));
        local_a0.capTable = local_60;
        local_a0.segment = pSVar2;
        local_a0.nestingLimit = iVar4;
        PVar5 = _::PointerReader::getPointerType(&local_a0);
        if (PVar5 != NULL_) goto LAB_0016756f;
        uVar11 = uVar11 - 0x40;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      uVar12 = 0;
    }
LAB_0016756f:
    local_70 = right._reader.segment;
    local_78 = right._reader.capTable;
    local_80 = right._reader.pointers;
    uVar11 = (ulong)right._reader.pointerCount;
    if (uVar11 != 0) {
      uVar9 = (ulong)right._reader.pointerCount * 0x40 + 0x3fffffffc0;
      do {
        local_a0.pointer =
             (WirePointer *)((long)&(local_80->offsetAndKind).value + (uVar9 >> 3 & 0x7fffffff8));
        local_a0.segment = local_70;
        local_a0.capTable = local_78;
        local_a0.nestingLimit = right._reader.nestingLimit;
        PVar5 = _::PointerReader::getPointerType(&local_a0);
        if (PVar5 != NULL_) goto LAB_00167606;
        uVar9 = uVar9 - 0x40;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
      uVar11 = 0;
    }
LAB_00167606:
    local_a8 = NOT_EQUAL;
    if (uVar12 == uVar11) {
      if (uVar12 == 0) {
        local_a8 = EQUAL;
      }
      else {
        local_a8 = EQUAL;
        uVar11 = 0;
        do {
          local_a0.pointer =
               (WirePointer *)((long)&(local_68->offsetAndKind).value + (uVar11 & 0x7fffffff8));
          local_a0.segment = local_58;
          local_a0.capTable = local_60;
          local_40 = (long)&(local_80->offsetAndKind).value + (uVar11 & 0x7fffffff8);
          local_50 = local_70;
          pCStack_48 = local_78;
          iStack_38 = right._reader.nestingLimit;
          right_00.reader._28_4_ = uStack_34;
          right_00.reader.nestingLimit = right._reader.nestingLimit;
          right_00.reader.capTable = local_78;
          right_00.reader.segment = local_70;
          right_00.reader.pointer = (WirePointer *)local_40;
          local_a0.nestingLimit = iVar4;
          EVar6 = AnyPointer::Reader::equals((Reader *)&local_a0,right_00);
          if (EVar6 == NOT_EQUAL) {
            bVar13 = false;
          }
          else {
            if (EVar6 != EQUAL) {
              if (EVar6 != UNKNOWN_CONTAINS_CAPS) {
                kj::_::unreachable();
              }
              local_a8 = UNKNOWN_CONTAINS_CAPS;
            }
            bVar13 = true;
          }
          if (!bVar13) {
            return NOT_EQUAL;
          }
          uVar11 = uVar11 + 8;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
    }
  }
  return local_a8;
}

Assistant:

Equality AnyStruct::Reader::equals(AnyStruct::Reader right) const {
  auto dataL = getDataSection();
  size_t dataSizeL = dataL.size();
  while(dataSizeL > 0 && dataL[dataSizeL - 1] == 0) {
    -- dataSizeL;
  }

  auto dataR = right.getDataSection();
  size_t dataSizeR = dataR.size();
  while(dataSizeR > 0 && dataR[dataSizeR - 1] == 0) {
    -- dataSizeR;
  }

  if(dataL.first(dataSizeL) != dataR.first(dataSizeR)) {
    return Equality::NOT_EQUAL;
  }

  auto ptrsL = getPointerSection();
  size_t ptrsSizeL = ptrsL.size();
  while (ptrsSizeL > 0 && ptrsL[ptrsSizeL - 1].isNull()) {
    -- ptrsSizeL;
  }

  auto ptrsR = right.getPointerSection();
  size_t ptrsSizeR = ptrsR.size();
  while (ptrsSizeR > 0 && ptrsR[ptrsSizeR - 1].isNull()) {
    -- ptrsSizeR;
  }

  if(ptrsSizeL != ptrsSizeR) {
    return Equality::NOT_EQUAL;
  }

  size_t i = 0;

  auto eqResult = Equality::EQUAL;
  for (; i < ptrsSizeL; i++) {
    auto l = ptrsL[i];
    auto r = ptrsR[i];
    switch(l.equals(r)) {
      case Equality::EQUAL:
        break;
      case Equality::NOT_EQUAL:
        return Equality::NOT_EQUAL;
      case Equality::UNKNOWN_CONTAINS_CAPS:
        eqResult = Equality::UNKNOWN_CONTAINS_CAPS;
        break;
      default:
        KJ_UNREACHABLE;
    }
  }

  return eqResult;
}